

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O3

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::addRelation
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *lt,Type type,Bucket *rt,
          Relations *maybeBetween)

{
  pointer prVar1;
  bool bVar2;
  Type TVar3;
  Type type_00;
  _Base_bitset<1UL> _Var4;
  ulong uVar5;
  Relations RVar6;
  Bucket *pBVar7;
  long lVar8;
  Relations between_1;
  pointer prVar9;
  Relations between;
  BucketSet intersect;
  _Base_bitset<1UL> local_50;
  BucketSet local_48;
  
  if (maybeBetween == (Relations *)0x0) {
    _Var4._M_w = (_WordT)relationsBetween(this,lt,rt);
  }
  else {
    _Var4._M_w = (maybeBetween->bits).super__Base_bitset<1UL>._M_w;
  }
  if ((_Var4._M_w >> ((ulong)type & 0x3f) & 1) != 0) {
    return false;
  }
  local_50._M_w = _Var4._M_w;
  pBVar7 = rt;
  switch(type) {
  case EQ:
    prVar9 = (lt->relatedBuckets)._M_elems[10].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((prVar9 != (lt->relatedBuckets)._M_elems[10].vec.
                   super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
       (prVar1 = (rt->relatedBuckets)._M_elems[10].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       prVar1 != (rt->relatedBuckets)._M_elems[10].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      addRelation(this,prVar9->_M_data,EQ,prVar1->_M_data,(Relations *)0x0);
    }
    bVar2 = setEqual(this,lt,rt);
    return bVar2;
  case NE:
    local_48.vec.
    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x500000003;
    local_48.vec.
    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x900000007;
    lVar8 = 0;
    do {
      TVar3 = *(Type *)((long)&local_48.vec.
                               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar8);
      RVar6 = relationsBetween(this,lt,rt);
      if (((ulong)RVar6.bits.super__Base_bitset<1UL>._M_w >> ((ulong)TVar3 & 0x3f) & 1) != 0) {
        return false;
      }
      uVar5 = dg::vr::Relations::getNonStrict(TVar3);
      if ((_Var4._M_w >> (uVar5 & 0x3f) & 1) != 0) {
        type_00 = dg::vr::Relations::getNonStrict(TVar3);
        unsetRelated(lt,type_00,rt);
        rt = lt;
        goto LAB_00124143;
      }
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x10);
    break;
  case SLE:
  case ULE:
    if ((_Var4._M_w & 2) != 0) {
      unsetRelated(lt,NE,rt);
      TVar3 = dg::vr::Relations::getStrict(type);
      rt = lt;
      goto LAB_00124143;
    }
    uVar5 = dg::vr::Relations::inverted(type);
    if ((_Var4._M_w >> (uVar5 & 0x3f) & 1) != 0) {
      TVar3 = dg::vr::Relations::inverted(type);
      getIntersectingNonstrict(&local_48,this,lt,rt,TVar3);
      prVar9 = local_48.vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      if (prVar9 != local_48.vec.
                    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar7 = (local_48.vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_data;
        do {
          setEqual(this,pBVar7,prVar9->_M_data);
          prVar9 = prVar9 + 1;
        } while (prVar9 != local_48.vec.
                           super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        if (local_48.vec.
            super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          return true;
        }
      }
      operator_delete(local_48.vec.
                      super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.vec.
                            super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.vec.
                            super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return true;
    }
    break;
  case SLT:
  case ULT:
    uVar5 = dg::vr::Relations::getNonStrict(type);
    if ((_Var4._M_w >> (uVar5 & 0x3f) & 1) != 0) {
      TVar3 = dg::vr::Relations::getNonStrict(type);
      unsetRelated(lt,TVar3,rt);
    }
    if ((_Var4._M_w & 2) != 0) {
      unsetRelated(lt,NE,rt);
    }
    break;
  case SGE:
  case SGT:
  case UGE:
  case UGT:
  case PF:
    dg::vr::Relations::invert();
    TVar3 = dg::vr::Relations::inverted(type);
    pBVar7 = lt;
LAB_00124143:
    bVar2 = addRelation(this,rt,TVar3,pBVar7,(Relations *)&local_50);
    return bVar2;
  case PT:
    prVar9 = (lt->relatedBuckets)._M_elems[10].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar9 != (lt->relatedBuckets)._M_elems[10].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = addRelation(this,prVar9->_M_data,EQ,rt,(Relations *)0x0);
      return bVar2;
    }
  }
  setRelated(lt,type,rt);
  return true;
}

Assistant:

bool addRelation(const Bucket &lt, Relations::Type type, const Bucket &rt,
                     Relations *maybeBetween = nullptr) {
        Bucket &mLt = const_cast<Bucket &>(lt);
        Bucket &mRt = const_cast<Bucket &>(rt);

        Relations between = fromMaybeBetween(lt, rt, maybeBetween);
        if (areRelated(lt, type, rt, &between))
            return false;
        assert(!haveConflictingRelation(lt, type, rt, &between));

        switch (type) {
        case Relations::EQ:
            if (lt.hasRelation(Relations::PT) &&
                rt.hasRelation(Relations::PT)) {
                addRelation(lt.getRelated(Relations::PT), Relations::EQ,
                            rt.getRelated(Relations::PT));
            }
            return setEqual(mLt, mRt);

        case Relations::NE:
            for (Relations::Type rel : {Relations::SLT, Relations::ULT,
                                        Relations::SGT, Relations::UGT}) {
                if (areRelated(lt, rel, rt))
                    return false;
                if (areRelated(lt, Relations::getNonStrict(rel), rt,
                               &between)) {
                    unsetRelated(mLt, Relations::getNonStrict(rel), mRt);
                    return addRelation(lt, rel, rt, &between);
                }
            }
            break; // jump after switch

        case Relations::SLT:
        case Relations::ULT:
            if (areRelated(lt, Relations::getNonStrict(type), rt, &between))
                unsetRelated(mLt, Relations::getNonStrict(type), mRt);
            if (areRelated(lt, Relations::NE, rt, &between))
                unsetRelated(mLt, Relations::NE, mRt);
            break; // jump after switch

        case Relations::SLE:
        case Relations::ULE:
            if (areRelated(lt, Relations::NE, rt, &between)) {
                unsetRelated(mLt, Relations::NE, mRt);
                return addRelation(lt, Relations::getStrict(type), rt,
                                   &between);
            }
            if (areRelated(lt, Relations::inverted(type), rt, &between)) {
                Bucket::BucketSet intersect = getIntersectingNonstrict(
                        lt, rt, Relations::inverted(type));
                assert(intersect.size() >= 2);
                Bucket &first = *intersect.begin();
                for (auto it = std::next(intersect.begin());
                     it != intersect.end(); ++it)
                    setEqual(first, *it);
                return true;
            }
            break; // jump after switch

        case Relations::PT:
            if (lt.hasRelation(type))
                return addRelation(lt.getRelated(type), Relations::EQ, rt);
            break; // jump after switch

        case Relations::SGT:
        case Relations::SGE:
        case Relations::UGT:
        case Relations::UGE:
        case Relations::PF: {
            between.invert();
            return addRelation(rt, Relations::inverted(type), lt, &between);
        }
        }
        setRelated(mLt, type, mRt);
        return true;
    }